

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_entry_isdir(zip_t *zip)

{
  uint uVar1;
  mz_zip_internal_state *pmVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (zip != (zip_t *)0x0) {
    uVar1 = (zip->entry).index;
    if (-1 < (int)uVar1) {
      uVar4 = 0;
      uVar5 = 0;
      if ((((zip != (zip_t *)0x0) &&
           (pmVar2 = (zip->archive).m_pState, uVar5 = uVar4, pmVar2 != (mz_zip_internal_state *)0x0)
           ) && (uVar1 < (zip->archive).m_total_files)) &&
         (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING &&
          (pvVar3 = (pmVar2->m_central_dir).m_p, pvVar3 != (void *)0x0)))) {
        uVar1 = *(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)uVar1 * 4);
        uVar6 = (ulong)*(ushort *)((long)pvVar3 + (ulong)uVar1 + 0x1c);
        if ((uVar6 == 0) ||
           (uVar5 = 1, *(char *)((long)pvVar3 + uVar6 + (ulong)uVar1 + 0x2d) != '/')) {
          uVar5 = *(byte *)((long)pvVar3 + (ulong)uVar1 + 0x26) >> 4 & 1;
        }
      }
      return uVar5;
    }
  }
  return -1;
}

Assistant:

int zip_entry_isdir(struct zip_t *zip) {
  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  if (zip->entry.index < 0) {
    // zip entry is not opened
    return -1;
  }

  return (int)mz_zip_reader_is_file_a_directory(&zip->archive,
                                                (mz_uint)zip->entry.index);
}